

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::ELU_x86_avx::forward_inplace(ELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  undefined1 (*pauVar7) [32];
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar8 = 0;
    auVar33 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar31 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    auVar32 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar26 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
    auVar29 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
    do {
      pauVar7 = (undefined1 (*) [32])
                (bottom_top_blob->cstep * lVar8 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      fVar12 = (this->super_ELU).alpha;
      auVar19._4_4_ = fVar12;
      auVar19._0_4_ = fVar12;
      auVar19._8_4_ = fVar12;
      auVar19._12_4_ = fVar12;
      auVar30 = auVar31._0_16_;
      if ((int)uVar6 < 8) {
        uVar4 = 0;
      }
      else {
        iVar2 = 7;
        do {
          auVar24 = vminps_avx(ZEXT1632(ZEXT816(0) << 0x40),*pauVar7);
          auVar22._8_4_ = 0x42b0c0a5;
          auVar22._0_8_ = 0x42b0c0a542b0c0a5;
          auVar22._12_4_ = 0x42b0c0a5;
          auVar22._16_4_ = 0x42b0c0a5;
          auVar22._20_4_ = 0x42b0c0a5;
          auVar22._24_4_ = 0x42b0c0a5;
          auVar22._28_4_ = 0x42b0c0a5;
          auVar24 = vminps_avx(auVar24,auVar22);
          auVar23._8_4_ = 0xc2b0c0a5;
          auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar23._12_4_ = 0xc2b0c0a5;
          auVar23._16_4_ = 0xc2b0c0a5;
          auVar23._20_4_ = 0xc2b0c0a5;
          auVar23._24_4_ = 0xc2b0c0a5;
          auVar23._28_4_ = 0xc2b0c0a5;
          auVar22 = vmaxps_avx(auVar24,auVar23);
          auVar24._0_4_ = auVar22._0_4_ * 1.442695 + 0.5;
          auVar24._4_4_ = auVar22._4_4_ * 1.442695 + 0.5;
          auVar24._8_4_ = auVar22._8_4_ * 1.442695 + 0.5;
          auVar24._12_4_ = auVar22._12_4_ * 1.442695 + 0.5;
          auVar24._16_4_ = auVar22._16_4_ * 1.442695 + 0.5;
          auVar24._20_4_ = auVar22._20_4_ * 1.442695 + 0.5;
          auVar24._24_4_ = auVar22._24_4_ * 1.442695 + 0.5;
          auVar24._28_4_ = 0x3ff8aa3b;
          auVar10 = vroundps_avx(auVar24,1);
          auVar24 = vcmpps_avx(auVar24,auVar10,1);
          auVar24 = vandps_avx(auVar33._0_32_,auVar24);
          auVar24 = vsubps_avx(auVar10,auVar24);
          fVar11 = auVar22._0_4_ + auVar24._0_4_ * -0.6931472;
          fVar13 = auVar22._4_4_ + auVar24._4_4_ * -0.6931472;
          fVar14 = auVar22._8_4_ + auVar24._8_4_ * -0.6931472;
          fVar15 = auVar22._12_4_ + auVar24._12_4_ * -0.6931472;
          fVar16 = auVar22._16_4_ + auVar24._16_4_ * -0.6931472;
          fVar17 = auVar22._20_4_ + auVar24._20_4_ * -0.6931472;
          fVar18 = auVar22._24_4_ + auVar24._24_4_ * -0.6931472;
          auVar27._0_4_ = (int)auVar24._0_4_;
          auVar27._4_4_ = (int)auVar24._4_4_;
          auVar27._8_4_ = (int)auVar24._8_4_;
          auVar27._12_4_ = (int)auVar24._12_4_;
          auVar25._16_4_ = (int)auVar24._16_4_;
          auVar25._0_16_ = auVar27;
          auVar25._20_4_ = (int)auVar24._20_4_;
          auVar25._24_4_ = (int)auVar24._24_4_;
          auVar25._28_4_ = (int)auVar24._28_4_;
          auVar27 = vpslld_avx(auVar27,0x17);
          auVar19 = vpslld_avx(auVar25._16_16_,0x17);
          auVar19 = vpaddd_avx(auVar19,auVar30);
          auVar27 = vpaddd_avx(auVar27,auVar30);
          auVar24 = vmaxps_avx(ZEXT1632(ZEXT816(0) << 0x40),*pauVar7);
          auVar10._0_4_ =
               ((auVar33._0_4_ + fVar11 +
                fVar11 * fVar11 *
                (((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) * fVar11 +
                  0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5)) * auVar27._0_4_ + -1.0) *
               fVar12 + auVar24._0_4_;
          auVar10._4_4_ =
               ((auVar33._4_4_ + fVar13 +
                fVar13 * fVar13 *
                (((((fVar13 * 0.00019875691 + 0.0013981999) * fVar13 + 0.008333452) * fVar13 +
                  0.041665796) * fVar13 + 0.16666666) * fVar13 + 0.5)) * auVar27._4_4_ + -1.0) *
               fVar12 + auVar24._4_4_;
          auVar10._8_4_ =
               ((auVar33._8_4_ + fVar14 +
                fVar14 * fVar14 *
                (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
                  0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5)) * auVar27._8_4_ + -1.0) *
               fVar12 + auVar24._8_4_;
          auVar10._12_4_ =
               ((auVar33._12_4_ + fVar15 +
                fVar15 * fVar15 *
                (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
                  0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar27._12_4_ + -1.0) *
               fVar12 + auVar24._12_4_;
          auVar10._16_4_ =
               ((auVar33._16_4_ + fVar16 +
                fVar16 * fVar16 *
                (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
                  0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar19._0_4_ + -1.0) *
               fVar12 + auVar24._16_4_;
          auVar10._20_4_ =
               ((auVar33._20_4_ + fVar17 +
                fVar17 * fVar17 *
                (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
                  0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar19._4_4_ + -1.0) *
               fVar12 + auVar24._20_4_;
          auVar10._24_4_ =
               ((auVar33._24_4_ + fVar18 +
                fVar18 * fVar18 *
                (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
                  0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar19._8_4_ + -1.0) *
               fVar12 + auVar24._24_4_;
          auVar10._28_4_ =
               auVar33._28_4_ + auVar22._28_4_ + -0.6931472 + -0.6931472 + -1.0 + auVar24._28_4_;
          *pauVar7 = auVar10;
          pauVar7 = pauVar7 + 1;
          iVar2 = iVar2 + 8;
        } while (iVar2 < (int)uVar6);
        auVar19 = ZEXT416((uint)(this->super_ELU).alpha);
        auVar32 = ZEXT464(0) << 0x40;
        auVar26 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
        auVar29 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        uVar4 = uVar6 & 0xfffffff8;
      }
      if ((int)(uVar4 | 3) < (int)uVar6) {
        auVar19 = vshufps_avx(auVar19,auVar19,0);
        uVar3 = uVar4;
        do {
          auVar27 = vminps_avx(auVar32._0_16_,*(undefined1 (*) [16])*pauVar7);
          auVar27 = vminps_avx(auVar27,auVar26._0_16_);
          auVar9 = vmaxps_avx(auVar27,auVar29._0_16_);
          auVar20._0_4_ = auVar9._0_4_ * 1.442695 + 0.5;
          auVar20._4_4_ = auVar9._4_4_ * 1.442695 + 0.5;
          auVar20._8_4_ = auVar9._8_4_ * 1.442695 + 0.5;
          auVar20._12_4_ = auVar9._12_4_ * 1.442695 + 0.5;
          auVar28._0_4_ = (int)auVar20._0_4_;
          auVar28._4_4_ = (int)auVar20._4_4_;
          auVar28._8_4_ = (int)auVar20._8_4_;
          auVar28._12_4_ = (int)auVar20._12_4_;
          auVar21 = vcvtdq2ps_avx(auVar28);
          auVar27 = vcmpps_avx(auVar20,auVar21,1);
          auVar27 = vandps_avx(auVar27,auVar30);
          auVar27 = vsubps_avx(auVar21,auVar27);
          fVar12 = auVar9._0_4_ + auVar27._0_4_ * -0.6931472;
          fVar11 = auVar9._4_4_ + auVar27._4_4_ * -0.6931472;
          fVar13 = auVar9._8_4_ + auVar27._8_4_ * -0.6931472;
          fVar14 = auVar9._12_4_ + auVar27._12_4_ * -0.6931472;
          auVar29 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
          auVar21._0_4_ = (int)auVar27._0_4_;
          auVar21._4_4_ = (int)auVar27._4_4_;
          auVar21._8_4_ = (int)auVar27._8_4_;
          auVar21._12_4_ = (int)auVar27._12_4_;
          auVar27 = vpslld_avx(auVar21,0x17);
          auVar21 = vpaddd_avx(auVar27,auVar30);
          auVar26 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
          auVar27 = vmaxps_avx(auVar32._0_16_,*(undefined1 (*) [16])*pauVar7);
          auVar9._0_4_ = ((fVar12 + auVar31._0_4_ +
                          fVar12 * fVar12 *
                          (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) *
                             fVar12 + 0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5)) *
                          auVar21._0_4_ + -1.0) * auVar19._0_4_ + auVar27._0_4_;
          auVar9._4_4_ = ((fVar11 + auVar31._4_4_ +
                          fVar11 * fVar11 *
                          (((((fVar11 * 0.00019875691 + 0.0013981999) * fVar11 + 0.008333452) *
                             fVar11 + 0.041665796) * fVar11 + 0.16666666) * fVar11 + 0.5)) *
                          auVar21._4_4_ + -1.0) * auVar19._4_4_ + auVar27._4_4_;
          auVar9._8_4_ = ((fVar13 + auVar31._8_4_ +
                          fVar13 * fVar13 *
                          (((((fVar13 * 0.00019875691 + 0.0013981999) * fVar13 + 0.008333452) *
                             fVar13 + 0.041665796) * fVar13 + 0.16666666) * fVar13 + 0.5)) *
                          auVar21._8_4_ + -1.0) * auVar19._8_4_ + auVar27._8_4_;
          auVar9._12_4_ =
               ((fVar14 + auVar31._12_4_ +
                fVar14 * fVar14 *
                (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
                  0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5)) * auVar21._12_4_ + -1.0) *
               auVar19._12_4_ + auVar27._12_4_;
          *(undefined1 (*) [16])*pauVar7 = auVar9;
          pauVar7 = (undefined1 (*) [32])(*pauVar7 + 0x10);
          uVar4 = uVar3 + 4;
          iVar2 = uVar3 + 7;
          uVar3 = uVar4;
        } while (iVar2 < (int)uVar6);
      }
      if (uVar6 - uVar4 != 0 && (int)uVar4 <= (int)uVar6) {
        lVar5 = 0;
        do {
          if (*(float *)(*pauVar7 + lVar5 * 4) < 0.0) {
            fVar12 = expf(*(float *)(*pauVar7 + lVar5 * 4));
            auVar29 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
            auVar26 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
            auVar32 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar31 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
            auVar33 = ZEXT3264(CONCAT428(0x3f800000,
                                         CONCAT424(0x3f800000,
                                                   CONCAT420(0x3f800000,
                                                             CONCAT416(0x3f800000,
                                                                       CONCAT412(0x3f800000,
                                                                                 CONCAT48(0x3f800000
                                                                                          ,
                                                  0x3f8000003f800000)))))));
            *(float *)(*pauVar7 + lVar5 * 4) = (fVar12 + -1.0) * (this->super_ELU).alpha;
          }
          lVar5 = lVar5 + 1;
        } while (uVar6 - uVar4 != (int)lVar5);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar1);
  }
  return 0;
}

Assistant:

int ELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}